

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

void __thiscall
Minisat::Heap<Minisat::SimpSolver::ElimLt>::update(Heap<Minisat::SimpSolver::ElimLt> *this,int n)

{
  if ((n < (this->indices).sz) && (-1 < (this->indices).data[n])) {
    percolateUp(this,(this->indices).data[n]);
    percolateDown(this,(this->indices).data[n]);
    return;
  }
  insert(this,n);
  return;
}

Assistant:

void update(int n)
    {
        if (!inHeap(n))
            insert(n);
        else {
            percolateUp(indices[n]);
            percolateDown(indices[n]);
        }
    }